

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O2

REF_STATUS ref_smooth_tet_weighted_ideal(REF_GRID ref_grid,REF_INT node,REF_DBL *ideal_location)

{
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  undefined8 uVar6;
  char *pcVar7;
  REF_STATUS RVar8;
  REF_INT tet;
  double dVar9;
  double dVar10;
  REF_DBL quality;
  ulong local_d8;
  double local_d0;
  REF_DBL tet_ideal [3];
  REF_INT nodes [27];
  
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    ideal_location[lVar4] = 0.0;
  }
  uVar5 = 0xffffffff;
  tet = -1;
  if (-1 < node) {
    pRVar1 = ref_grid->cell[8]->ref_adj;
    uVar5 = 0xffffffff;
    tet = -1;
    if (node < pRVar1->nnode) {
      uVar3 = pRVar1->first[(uint)node];
      uVar5 = 0xffffffff;
      tet = -1;
      if ((long)(int)uVar3 != -1) {
        tet = pRVar1->item[(int)uVar3].ref;
        uVar5 = (ulong)uVar3;
      }
    }
  }
  dVar10 = 0.0;
  while( true ) {
    if ((int)uVar5 == -1) {
      dVar9 = dVar10 * 1e+20;
      if (dVar9 <= -dVar9) {
        dVar9 = -dVar9;
      }
      if (dVar9 <= 1.0) {
        printf("normalization = %e\n",dVar10);
        RVar8 = 4;
      }
      else {
        RVar8 = 0;
        for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
          ideal_location[lVar4] = ideal_location[lVar4] * (1.0 / dVar10);
        }
      }
      return RVar8;
    }
    local_d8 = uVar5;
    local_d0 = dVar10;
    uVar3 = ref_smooth_tet_ideal(ref_grid,node,tet,tet_ideal);
    if (uVar3 != 0) break;
    uVar3 = ref_cell_nodes(ref_grid->cell[8],tet,nodes);
    if (uVar3 != 0) {
      uVar5 = (ulong)uVar3;
      pcVar7 = "nodes";
      uVar6 = 0x56a;
      goto LAB_001d7dd7;
    }
    uVar3 = ref_node_tet_quality(ref_grid->node,nodes,&quality);
    if (uVar3 != 0) {
      uVar5 = (ulong)uVar3;
      pcVar7 = "tet qual";
      uVar6 = 0x56c;
      goto LAB_001d7dd7;
    }
    dVar10 = ref_grid->adapt->smooth_min_quality;
    if (quality <= dVar10) {
      quality = dVar10;
    }
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      ideal_location[lVar4] = tet_ideal[lVar4] * (1.0 / quality) + ideal_location[lVar4];
    }
    dVar10 = local_d0 + 1.0 / quality;
    pRVar2 = ref_grid->cell[8]->ref_adj->item;
    uVar5 = (ulong)pRVar2[(int)local_d8].next;
    tet = -1;
    if (uVar5 != 0xffffffffffffffff) {
      tet = pRVar2[uVar5].ref;
    }
  }
  uVar5 = (ulong)uVar3;
  pcVar7 = "tet ideal";
  uVar6 = 0x569;
LAB_001d7dd7:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar6,
         "ref_smooth_tet_weighted_ideal",uVar5,pcVar7);
  return (REF_STATUS)uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tet_weighted_ideal(REF_GRID ref_grid,
                                                 REF_INT node,
                                                 REF_DBL *ideal_location) {
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT ixyz;
  REF_DBL tet_ideal[3];
  REF_DBL quality, weight, normalization;

  normalization = 0.0;
  for (ixyz = 0; ixyz < 3; ixyz++) ideal_location[ixyz] = 0.0;

  each_ref_cell_having_node(ref_grid_tet(ref_grid), node, item, cell) {
    RSS(ref_smooth_tet_ideal(ref_grid, node, cell, tet_ideal), "tet ideal");
    RSS(ref_cell_nodes(ref_grid_tet(ref_grid), cell, nodes), "nodes");
    RSS(ref_node_tet_quality(ref_grid_node(ref_grid), nodes, &quality),
        "tet qual");
    quality = MAX(quality, ref_grid_adapt(ref_grid, smooth_min_quality));
    weight = 1.0 / quality;
    normalization += weight;
    for (ixyz = 0; ixyz < 3; ixyz++)
      ideal_location[ixyz] += weight * tet_ideal[ixyz];
  }

  if (ref_math_divisible(1.0, normalization)) {
    for (ixyz = 0; ixyz < 3; ixyz++)
      ideal_location[ixyz] = (1.0 / normalization) * ideal_location[ixyz];
  } else {
    printf("normalization = %e\n", normalization);
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}